

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O0

bool __thiscall
lan::db::append<int>(db *this,db_bit *context,string *name,int value,db_bit_type type)

{
  bool bVar1;
  string *context_00;
  db_bit *pdVar2;
  bool local_c9;
  string local_88;
  byte local_61;
  string local_60;
  db_bit_type local_30;
  int local_2c;
  db_bit_type type_local;
  int value_local;
  string *name_local;
  db_bit *context_local;
  db *this_local;
  
  this->data = context;
  if ((this->data->type == Container) &&
     (pdVar2 = this->data->lin, this->data = pdVar2, pdVar2 != (db_bit *)0x0)) {
    local_30 = type;
    local_2c = value;
    _type_local = name;
    name_local = &context->key;
    context_local = (db_bit *)this;
    pdVar2 = get_last_bit(this,this->data);
    this->data = pdVar2;
    pdVar2 = (db_bit *)operator_new(0x50);
    db_bit::db_bit(pdVar2);
    context_00 = name_local;
    this->data->nex = pdVar2;
    this->data->nex->pre = this->data;
    this->data = this->data->nex;
    local_61 = 0;
    bVar1 = 8 < (int)local_30;
    if (bVar1) {
      pdVar2 = this->data;
      std::__cxx11::string::string((string *)&local_88,(string *)name);
      local_c9 = set_bit(this,(db_bit *)context_00,pdVar2,&local_88,local_30);
    }
    else {
      pdVar2 = this->data;
      std::__cxx11::string::string((string *)&local_60,(string *)name);
      local_61 = 1;
      local_c9 = set_bit<int>(this,(db_bit *)context_00,pdVar2,&local_60,local_30,local_2c);
    }
    this_local._7_1_ = local_c9;
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((local_61 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool append(lan::db_bit * context, std::string const name, any const value, db_bit_type const type){
            data = context;
            if(data-> type == lan::Container and (data = data->lin)){
                data = get_last_bit(data);
                data->nex = new db_bit; data->nex->pre = data; data = data->nex;
                return ((type < lan::Array) ? set_bit(context, data, name, type, value) : set_bit(context, data, name, type));
            } return false;
        }